

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_vt_ref_t
flatcc_builder_create_cached_vtable
          (flatcc_builder_t *B,flatbuffers_voffset_t *vt,flatbuffers_voffset_t vt_size,
          uint32_t vt_hash)

{
  uint *puVar1;
  uint uVar2;
  flatbuffers_uoffset_t fVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  flatcc_builder_vt_ref_t fVar7;
  void *pvVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  flatcc_builder_vt_ref_t *pfVar12;
  flatcc_builder_vt_ref_t fVar13;
  uint *puVar14;
  flatcc_builder_vt_ref_t *local_38;
  
  sVar9 = B->ht_width;
  if (sVar9 == 0) {
    if (B->vd_end != 0) {
      __assert_fail("B->vd_end == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x15e,"int alloc_ht(flatcc_builder_t *)");
    }
    pvVar8 = reserve_buffer(B,6,0,0x10,0);
    if (pvVar8 == (void *)0x0) {
      return 0;
    }
    B->vd_end = 0x10;
    iVar6 = (*B->alloc)(B->alloc_context,B->buffers + 5,0x100,1,5);
    if (iVar6 != 0) {
      return 0;
    }
    uVar5 = 0x100;
    do {
      uVar10 = uVar5;
      uVar5 = uVar10 * 2;
    } while (uVar5 <= B->buffers[5].iov_len);
    sVar9 = 0xffffffffffffffff;
    do {
      sVar9 = sVar9 + 1;
    } while ((ulong)(1L << ((byte)sVar9 & 0x3f)) < uVar10 >> 2);
    B->ht_width = sVar9;
  }
  pvVar8 = B->buffers[5].iov_base;
  if (pvVar8 == (void *)0x0) {
    fVar13 = 0;
  }
  else {
    puVar1 = (uint *)((long)pvVar8 + (ulong)(vt_hash >> (-(char)sVar9 & 0x1fU)) * 4);
    uVar5 = (ulong)vt_size;
    local_38 = (flatcc_builder_vt_ref_t *)0x0;
    puVar14 = puVar1;
    while( true ) {
      uVar2 = *puVar14;
      uVar10 = (ulong)uVar2;
      if (uVar10 == 0) break;
      pvVar8 = B->buffers[2].iov_base;
      pvVar4 = B->buffers[6].iov_base;
      uVar11 = (ulong)*(uint *)((long)pvVar4 + uVar10 + 8);
      pfVar12 = (flatcc_builder_vt_ref_t *)((long)pvVar4 + uVar10);
      if ((*(flatbuffers_voffset_t *)(uVar11 + (long)pvVar8) == vt_size) &&
         (iVar6 = bcmp(vt,(void *)(uVar11 + (long)pvVar8),uVar5), iVar6 == 0)) {
        if (pfVar12[1] == B->nest_id) {
          if (puVar14 != puVar1) {
            *puVar14 = pfVar12[3];
            pfVar12[3] = *puVar1;
            *puVar1 = uVar2;
          }
          goto LAB_0010530d;
        }
        puVar14 = (uint *)(pfVar12 + 3);
        local_38 = pfVar12;
      }
      else {
        puVar14 = (uint *)(pfVar12 + 3);
      }
    }
    pfVar12 = (flatcc_builder_vt_ref_t *)reserve_buffer(B,6,(ulong)B->vd_end,0x10,0);
    fVar13 = 0;
    if (pfVar12 != (flatcc_builder_vt_ref_t *)0x0) {
      uVar2 = B->vd_end;
      B->vd_end = uVar2 + 0x10;
      pfVar12[1] = B->nest_id;
      pfVar12[3] = *puVar1;
      *puVar1 = uVar2;
      fVar7 = flatcc_builder_create_vtable(B,vt,vt_size);
      *pfVar12 = fVar7;
      fVar13 = 0;
      if (fVar7 != 0) {
        if (local_38 == (flatcc_builder_vt_ref_t *)0x0) {
          if ((B->vb_flush_limit == 0) || ((ulong)(B->vb_end + (uint)vt_size) <= B->vb_flush_limit))
          {
            pvVar8 = reserve_buffer(B,2,(ulong)B->vb_end,uVar5,0);
            if (pvVar8 == (void *)0x0) {
              return -1;
            }
            fVar3 = B->vb_end;
            pfVar12[2] = fVar3;
            B->vb_end = vt_size + fVar3;
            memcpy(pvVar8,vt,uVar5);
          }
          else {
            flatcc_builder_flush_vtable_cache(B);
          }
        }
        else {
          pfVar12[2] = local_38[2];
        }
LAB_0010530d:
        fVar13 = *pfVar12;
      }
    }
  }
  return fVar13;
}

Assistant:

flatcc_builder_vt_ref_t flatcc_builder_create_cached_vtable(flatcc_builder_t *B,
        const voffset_t *vt, voffset_t vt_size, uint32_t vt_hash)
{
    vtable_descriptor_t *vd, *vd2;
    uoffset_t *pvd, *pvd_head;
    uoffset_t next;
    voffset_t *vt_;

    /* This just gets the hash table slot, we still have to inspect it. */
    if (!(pvd_head = lookup_ht(B, vt_hash))) {
        return 0;
    }
    pvd = pvd_head;
    next = *pvd;
    /* Tracks if there already is a cached copy. */
    vd2 = 0;
    while (next) {
        vd = vd_ptr(next);
        vt_ = vb_ptr(vd->vb_start);
        if (vt_[0] != vt_size || 0 != memcmp(vt, vt_, vt_size)) {
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Can't share emitted vtables between buffers, */
        if (vd->nest_id != B->nest_id) {
            /* but we don't have to resubmit to cache. */
            vd2 = vd;
            /* See if there is a better match. */
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Move to front hash strategy. */
        if (pvd != pvd_head) {
            *pvd = vd->next;
            vd->next = *pvd_head;
            *pvd_head = next;
        }
        /* vtable exists and has been emitted within current buffer. */
        return vd->vt_ref;
    }
    /* Allocate new descriptor. */
    if (!(vd = reserve_buffer(B, flatcc_builder_alloc_vd, B->vd_end, sizeof(vtable_descriptor_t), 0))) {
        return 0;
    }
    next = B->vd_end;
    B->vd_end += (uoffset_t)sizeof(vtable_descriptor_t);

    /* Identify the buffer this vtable descriptor belongs to. */
    vd->nest_id = B->nest_id;

    /* Move to front hash strategy. */
    vd->next = *pvd_head;
    *pvd_head = next;
    if (0 == (vd->vt_ref = flatcc_builder_create_vtable(B, vt, vt_size))) {
        return 0;
    }
    if (vd2) {
        /* Reuse cached copy. */
        vd->vb_start = vd2->vb_start;
    } else {
        if (B->vb_flush_limit && B->vb_flush_limit < B->vb_end + vt_size) {
            flatcc_builder_flush_vtable_cache(B);
        } else {
            /* Make space in vtable cache. */
            if (!(vt_ = reserve_buffer(B, flatcc_builder_alloc_vb, B->vb_end, vt_size, 0))) {
                return -1;
            }
            vd->vb_start = B->vb_end;
            B->vb_end += vt_size;
            memcpy(vt_, vt, vt_size);
        }
    }
    return vd->vt_ref;
}